

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

string * __thiscall
deqp::gls::BuiltinPrecisionTests::
GenFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Signature<float,float,int,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>
::getName_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,*(long *)((long)this + 0x28),
             *(long *)((long)this + 0x30) + *(long *)((long)this + 0x28));
  return __return_storage_ptr__;
}

Assistant:

string				getName				(void) const
	{
		return m_name;
	}